

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

VP8StatusCode WebPDecode(uint8_t *data,size_t data_size,WebPDecoderConfig *config)

{
  WebPDecBuffer *output;
  VP8StatusCode VVar1;
  int iVar2;
  WebPDecParams local_118;
  WebPDecBuffer local_a8;
  
  VVar1 = VP8_STATUS_INVALID_PARAM;
  if (data != (uint8_t *)0x0 && config != (WebPDecoderConfig *)0x0) {
    (config->input).format = 0;
    (config->input).pad[0] = 0;
    (config->input).pad[1] = 0;
    (config->input).pad[2] = 0;
    (config->input).width = 0;
    (config->input).height = 0;
    (config->input).has_alpha = 0;
    (config->input).has_animation = 0;
    (config->input).pad[3] = 0;
    (config->input).pad[4] = 0;
    VVar1 = ParseHeadersInternal
                      (data,data_size,(int *)config,&(config->input).height,
                       &(config->input).has_alpha,&(config->input).has_animation,
                       &(config->input).format,(WebPHeaderStructure *)0x0);
    if (VVar1 == VP8_STATUS_OK) {
      local_118.scaler_y = (WebPRescaler *)0x0;
      local_118.emit = (OutputFunc)0x0;
      local_118.emit_alpha = (OutputAlphaFunc)0x0;
      local_118.scaler_a = (WebPRescaler *)0x0;
      local_118.memory = (void *)0x0;
      local_118.scaler_u = (WebPRescaler *)0x0;
      local_118.scaler_v = (WebPRescaler *)0x0;
      local_118.tmp_v = (uint8_t *)0x0;
      local_118.last_y = 0;
      local_118._36_4_ = 0;
      local_118.tmp_y = (uint8_t *)0x0;
      local_118.tmp_u = (uint8_t *)0x0;
      local_118.emit_alpha_row = (OutputRowFunc)0x0;
      local_118.options = &config->options;
      output = &config->output;
      local_118.output = output;
      iVar2 = WebPAvoidSlowMemory(output,&config->input);
      if (iVar2 != 0) {
        iVar2 = WebPInitDecBufferInternal(&local_a8,0x209);
        if (iVar2 == 0) {
          return VP8_STATUS_INVALID_PARAM;
        }
        local_a8.colorspace = (config->output).colorspace;
        local_a8.width = (config->input).width;
        local_a8.height = (config->input).height;
        local_118.output = &local_a8;
        VVar1 = DecodeInto(data,data_size,&local_118);
        if (VVar1 == VP8_STATUS_OK) {
          VVar1 = WebPCopyDecBufferPixels(&local_a8,output);
        }
        WebPFreeDecBuffer(&local_a8);
        return VVar1;
      }
      VVar1 = DecodeInto(data,data_size,&local_118);
    }
    else if (VVar1 == VP8_STATUS_NOT_ENOUGH_DATA) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  return VVar1;
}

Assistant:

VP8StatusCode WebPDecode(const uint8_t* data, size_t data_size,
                         WebPDecoderConfig* config) {
  WebPDecParams params;
  VP8StatusCode status;

  if (config == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }

  status = GetFeatures(data, data_size, &config->input);
  if (status != VP8_STATUS_OK) {
    if (status == VP8_STATUS_NOT_ENOUGH_DATA) {
      return VP8_STATUS_BITSTREAM_ERROR;  // Not-enough-data treated as error.
    }
    return status;
  }

  WebPResetDecParams(&params);
  params.options = &config->options;
  params.output = &config->output;
  if (WebPAvoidSlowMemory(params.output, &config->input)) {
    // decoding to slow memory: use a temporary in-mem buffer to decode into.
    WebPDecBuffer in_mem_buffer;
    if (!WebPInitDecBuffer(&in_mem_buffer)) {
      return VP8_STATUS_INVALID_PARAM;
    }
    in_mem_buffer.colorspace = config->output.colorspace;
    in_mem_buffer.width = config->input.width;
    in_mem_buffer.height = config->input.height;
    params.output = &in_mem_buffer;
    status = DecodeInto(data, data_size, &params);
    if (status == VP8_STATUS_OK) {  // do the slow-copy
      status = WebPCopyDecBufferPixels(&in_mem_buffer, &config->output);
    }
    WebPFreeDecBuffer(&in_mem_buffer);
  } else {
    status = DecodeInto(data, data_size, &params);
  }

  return status;
}